

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwindowsysteminterface.cpp
# Opt level: O2

bool QWindowSystemInterface::handleKeyEvent<QWindowSystemInterface::SynchronousDelivery>
               (QWindow *window,ulong timestamp,Type t,int k,KeyboardModifiers mods,QString *text,
               bool autorep,ushort count)

{
  Data *pDVar1;
  QString args_5;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = (text->d).d;
  local_30.ptr = (text->d).ptr;
  local_30.size = (text->d).size;
  if (pDVar1 == (Data *)0x0) {
    local_30.d = (Data *)0x0;
  }
  else {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_30.d = pDVar1;
  }
  if (local_30.d != (Data *)0x0) {
    LOCK();
    ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  args_5.d.ptr._0_2_ = count;
  args_5.d.d = (Data *)(ulong)autorep;
  args_5.d.ptr._2_6_ = 0;
  args_5.d.size = (qsizetype)pDVar1;
  bVar2 = QWindowSystemHelper<QWindowSystemInterface::SynchronousDelivery>::
          handleEvent<QWindowSystemInterfacePrivate::KeyEvent,QWindow*,unsigned_long,QEvent::Type,int,QFlags<Qt::KeyboardModifier>,QString,bool,unsigned_short>
                    (window,timestamp,t,k,
                     (QFlags<Qt::KeyboardModifier>)
                     mods.super_QFlagsStorageHelper<Qt::KeyboardModifier,_4>.
                     super_QFlagsStorage<Qt::KeyboardModifier>.i,args_5,SUB81(&local_30,0),
                     (unsigned_short)local_30.ptr);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
  QArrayDataPointer<char16_t>::~QArrayDataPointer
            ((QArrayDataPointer<char16_t> *)&stack0xffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

QT_DEFINE_QPA_EVENT_HANDLER(bool, handleKeyEvent, QWindow *window, ulong timestamp, QEvent::Type t, int k, Qt::KeyboardModifiers mods, const QString & text, bool autorep, ushort count)
{
    return handleWindowSystemEvent<QWindowSystemInterfacePrivate::KeyEvent, Delivery>(window,
        timestamp, t, k, mods, text, autorep, count);
}